

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::GLSLConstantIntegralExpressionTest::getVerificationSnippet_abi_cxx11_
          (string *__return_storage_ptr__,GLSLConstantIntegralExpressionTest *this,GLuint param_1,
          ProgramInterface *param_2,STAGES param_3)

{
  size_t position;
  GLchar buffer [16];
  size_t local_40;
  allocator<char> local_38 [24];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "{\n        uint goku_sum = 0;\n        uint gohan_sum = 0;\n        uint goten_sum = 0;\n\n        for (uint i = 0u; i < goku.length(); ++i)\n        {\n            goku_sum += goku[i];\n        }\n\n        for (uint i = 0u; i < gohan.length(); ++i)\n        {\n            gohan_sum += gohan[i];\n        }\n\n        for (uint i = 0u; i < goten.length(); ++i)\n        {\n            goten_sum += goten[i];\n        }\n\n        if ( (1u != goku_sum)  &&\n             (EXPECTED_GOHAN_SUMu != gohan_sum) ||\n             (EXPECTED_GOTEN_SUMu != goten_sum) )\n        {\n            result = 0u;\n        }\n    }\n"
             ,local_38);
  local_40 = 0;
  sprintf((char *)local_38,"%d",(ulong)(uint)this->m_gohan_length);
  Utils::replaceToken("EXPECTED_GOHAN_SUM",&local_40,(GLchar *)local_38,__return_storage_ptr__);
  sprintf((char *)local_38,"%d",(ulong)(uint)this->m_goten_length);
  Utils::replaceToken("EXPECTED_GOTEN_SUM",&local_40,(GLchar *)local_38,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GLSLConstantIntegralExpressionTest::getVerificationSnippet(GLuint /* test_case_index */,
																	   Utils::ProgramInterface& /* program_interface */,
																	   Utils::Shader::STAGES /* stage */)
{
	std::string verification = "{\n"
							   "        uint goku_sum = 0;\n"
							   "        uint gohan_sum = 0;\n"
							   "        uint goten_sum = 0;\n"
							   "\n"
							   "        for (uint i = 0u; i < goku.length(); ++i)\n"
							   "        {\n"
							   "            goku_sum += goku[i];\n"
							   "        }\n"
							   "\n"
							   "        for (uint i = 0u; i < gohan.length(); ++i)\n"
							   "        {\n"
							   "            gohan_sum += gohan[i];\n"
							   "        }\n"
							   "\n"
							   "        for (uint i = 0u; i < goten.length(); ++i)\n"
							   "        {\n"
							   "            goten_sum += goten[i];\n"
							   "        }\n"
							   "\n"
							   "        if ( (1u != goku_sum)  &&\n"
							   "             (EXPECTED_GOHAN_SUMu != gohan_sum) ||\n"
							   "             (EXPECTED_GOTEN_SUMu != goten_sum) )\n"
							   "        {\n"
							   "            result = 0u;\n"
							   "        }\n"
							   "    }\n";

	size_t position = 0;
	GLchar buffer[16];

	sprintf(buffer, "%d", m_gohan_length);
	Utils::replaceToken("EXPECTED_GOHAN_SUM", position, buffer, verification);

	sprintf(buffer, "%d", m_goten_length);
	Utils::replaceToken("EXPECTED_GOTEN_SUM", position, buffer, verification);

	return verification;
}